

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga.c
# Opt level: O0

void xc_mgga_sanity_check(xc_func_info_type *info,int order,xc_mgga_out_params *out)

{
  long *in_RDX;
  uint in_ESI;
  long in_RDI;
  
  if (((int)in_ESI < 0) || (4 < (int)in_ESI)) {
    fprintf(_stderr,"Order of derivatives \'%d\' not implemented\n",(ulong)in_ESI);
    exit(1);
  }
  if ((*in_RDX != 0) && ((*(uint *)(in_RDI + 0x40) & 1) == 0)) {
    fprintf(_stderr,"Functional \'%s\' does not provide an implementation of Exc\n",
            *(undefined8 *)(in_RDI + 8));
    exit(1);
  }
  if (in_RDX[1] != 0) {
    if ((*(uint *)(in_RDI + 0x40) & 2) == 0) {
      fprintf(_stderr,"Functional \'%s\' does not provide an implementation of vxc\n",
              *(undefined8 *)(in_RDI + 8));
      exit(1);
    }
    if (in_RDX[2] == 0) {
      fprintf(_stderr,"error: output variable, out->vsigma, is a null pointer\n");
      exit(1);
    }
    if (((*(uint *)(in_RDI + 0x40) & 0x8000) != 0) && (in_RDX[3] == 0)) {
      fprintf(_stderr,"error: output variable, out->vlapl, is a null pointer\n");
      exit(1);
    }
    if (((*(uint *)(in_RDI + 0x40) & 0x10000) != 0) && (in_RDX[4] == 0)) {
      fprintf(_stderr,"error: output variable, out->vtau, is a null pointer\n");
      exit(1);
    }
  }
  if (in_RDX[5] != 0) {
    if ((*(uint *)(in_RDI + 0x40) & 4) == 0) {
      fprintf(_stderr,"Functional \'%s\' does not provide an implementation of fxc\n",
              *(undefined8 *)(in_RDI + 8));
      exit(1);
    }
    if (in_RDX[6] == 0) {
      fprintf(_stderr,"error: output variable, out->v2rhosigma, is a null pointer\n");
      exit(1);
    }
    if (in_RDX[9] == 0) {
      fprintf(_stderr,"error: output variable, out->v2sigma2, is a null pointer\n");
      exit(1);
    }
    if ((*(uint *)(in_RDI + 0x40) & 0x8000) != 0) {
      if (in_RDX[7] == 0) {
        fprintf(_stderr,"error: output variable, out->v2rholapl, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[10] == 0) {
        fprintf(_stderr,"error: output variable, out->v2sigmalapl, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0xc] == 0) {
        fprintf(_stderr,"error: output variable, out->v2lapl2, is a null pointer\n");
        exit(1);
      }
    }
    if ((*(uint *)(in_RDI + 0x40) & 0x10000) != 0) {
      if (in_RDX[8] == 0) {
        fprintf(_stderr,"error: output variable, out->v2rhotau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0xb] == 0) {
        fprintf(_stderr,"error: output variable, out->v2sigmatau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0xe] == 0) {
        fprintf(_stderr,"error: output variable, out->v2tau2, is a null pointer\n");
        exit(1);
      }
    }
    if ((((*(uint *)(in_RDI + 0x40) & 0x8000) != 0) && ((*(uint *)(in_RDI + 0x40) & 0x10000) != 0))
       && (in_RDX[0xd] == 0)) {
      fprintf(_stderr,"error: output variable, out->v2lapltau, is a null pointer\n");
      exit(1);
    }
  }
  if (in_RDX[0xf] != 0) {
    if ((*(uint *)(in_RDI + 0x40) & 8) == 0) {
      fprintf(_stderr,"Functional \'%s\' does not provide an implementation of kxc\n",
              *(undefined8 *)(in_RDI + 8));
      exit(1);
    }
    if (in_RDX[0x10] == 0) {
      fprintf(_stderr,"error: output variable, out->v3rho2sigma, is a null pointer\n");
      exit(1);
    }
    if (in_RDX[0x13] == 0) {
      fprintf(_stderr,"error: output variable, out->v3rhosigma2, is a null pointer\n");
      exit(1);
    }
    if (in_RDX[0x19] == 0) {
      fprintf(_stderr,"error: output variable, out->v3sigma3, is a null pointer\n");
      exit(1);
    }
    if ((*(uint *)(in_RDI + 0x40) & 0x8000) != 0) {
      if (in_RDX[0x11] == 0) {
        fprintf(_stderr,"error: output variable, out->v3rho2lapl, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x14] == 0) {
        fprintf(_stderr,"error: output variable, out->v3rhosigmalapl, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x16] == 0) {
        fprintf(_stderr,"error: output variable, out->v3rholapl2, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x1a] == 0) {
        fprintf(_stderr,"error: output variable, out->v3sigma2lapl, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x1c] == 0) {
        fprintf(_stderr,"error: output variable, out->v3sigmalapl2, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x1f] == 0) {
        fprintf(_stderr,"error: output variable, out->v3lapl3, is a null pointer\n");
        exit(1);
      }
    }
    if ((*(uint *)(in_RDI + 0x40) & 0x10000) != 0) {
      if (in_RDX[0x12] == 0) {
        fprintf(_stderr,"error: output variable, out->v3rho2tau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x15] == 0) {
        fprintf(_stderr,"error: output variable, out->v3rhosigmatau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x18] == 0) {
        fprintf(_stderr,"error: output variable, out->v3rhotau2, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x1b] == 0) {
        fprintf(_stderr,"error: output variable, out->v3sigma2tau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x1e] == 0) {
        fprintf(_stderr,"error: output variable, out->v3sigmatau2, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x22] == 0) {
        fprintf(_stderr,"error: output variable, out->v3tau3, is a null pointer\n");
        exit(1);
      }
    }
    if (((*(uint *)(in_RDI + 0x40) & 0x8000) != 0) && ((*(uint *)(in_RDI + 0x40) & 0x10000) != 0)) {
      if (in_RDX[0x17] == 0) {
        fprintf(_stderr,"error: output variable, out->v3rholapltau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x1d] == 0) {
        fprintf(_stderr,"error: output variable, out->v3sigmalapltau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x20] == 0) {
        fprintf(_stderr,"error: output variable, out->v3lapl2tau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x21] == 0) {
        fprintf(_stderr,"error: output variable, out->v3lapltau2, is a null pointer\n");
        exit(1);
      }
    }
  }
  if (in_RDX[0x23] != 0) {
    if ((*(uint *)(in_RDI + 0x40) & 0x10) == 0) {
      fprintf(_stderr,"Functional \'%s\' does not provide an implementation of lxc\n",
              *(undefined8 *)(in_RDI + 8));
      exit(1);
    }
    if (in_RDX[0x24] == 0) {
      fprintf(_stderr,"error: output variable, out->v4rho3sigma, is a null pointer\n");
      exit(1);
    }
    if (in_RDX[0x27] == 0) {
      fprintf(_stderr,"error: output variable, out->v4rho2sigma2, is a null pointer\n");
      exit(1);
    }
    if (in_RDX[0x2d] == 0) {
      fprintf(_stderr,"error: output variable, out->v4rhosigma3, is a null pointer\n");
      exit(1);
    }
    if (in_RDX[0x37] == 0) {
      fprintf(_stderr,"error: output variable, out->v4sigma4, is a null pointer\n");
      exit(1);
    }
    if ((*(uint *)(in_RDI + 0x40) & 0x8000) != 0) {
      if (in_RDX[0x25] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rho3lapl, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x28] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rho2sigmalapl, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x2a] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rho2lapl2, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x2e] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rhosigma2lapl, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x30] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rhosigmalapl2, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x33] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rholapl3, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x38] == 0) {
        fprintf(_stderr,"error: output variable, out->v4sigma3lapl, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x3a] == 0) {
        fprintf(_stderr,"error: output variable, out->v4sigma2lapl2, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x3d] == 0) {
        fprintf(_stderr,"error: output variable, out->v4sigmalapl3, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x41] == 0) {
        fprintf(_stderr,"error: output variable, out->v4lapl4, is a null pointer\n");
        exit(1);
      }
    }
    if ((*(uint *)(in_RDI + 0x40) & 0x10000) != 0) {
      if (in_RDX[0x26] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rho3tau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x29] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rho2sigmatau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x2c] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rho2tau2, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x2f] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rhosigma2tau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x32] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rhosigmatau2, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x36] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rhotau3, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x39] == 0) {
        fprintf(_stderr,"error: output variable, out->v4sigma3tau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x3c] == 0) {
        fprintf(_stderr,"error: output variable, out->v4sigma2tau2, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x40] == 0) {
        fprintf(_stderr,"error: output variable, out->v4sigmatau3, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x45] == 0) {
        fprintf(_stderr,"error: output variable, out->v4tau4, is a null pointer\n");
        exit(1);
      }
    }
    if (((*(uint *)(in_RDI + 0x40) & 0x8000) != 0) && ((*(uint *)(in_RDI + 0x40) & 0x10000) != 0)) {
      if (in_RDX[0x2b] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rho2lapltau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x31] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rhosigmalapltau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x34] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rholapl2tau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x35] == 0) {
        fprintf(_stderr,"error: output variable, out->v4rholapltau2, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x3b] == 0) {
        fprintf(_stderr,"error: output variable, out->v4sigma2lapltau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x3e] == 0) {
        fprintf(_stderr,"error: output variable, out->v4sigmalapl2tau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x3f] == 0) {
        fprintf(_stderr,"error: output variable, out->v4sigmalapltau2, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x42] == 0) {
        fprintf(_stderr,"error: output variable, out->v4lapl3tau, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x43] == 0) {
        fprintf(_stderr,"error: output variable, out->v4lapl2tau2, is a null pointer\n");
        exit(1);
      }
      if (in_RDX[0x44] == 0) {
        fprintf(_stderr,"error: output variable, out->v4lapltau3, is a null pointer\n");
        exit(1);
      }
    }
  }
  return;
}

Assistant:

void
xc_mgga_sanity_check(const xc_func_info_type *info, int order, xc_mgga_out_params *out)
{
  /* sanity check */
  if(order < 0 || order > 4){
    fprintf(stderr, "Order of derivatives '%d' not implemented\n",
            order);
    exit(1);
  }
  
  /* sanity check */
  if(out->zk != NULL && !(info->flags & XC_FLAGS_HAVE_EXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of Exc\n",
	    info->name);
    exit(1);
  }

  if(out->vrho != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_VXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of vxc\n",
              info->name);
      exit(1);
    }
    check_out_var(vsigma);
    if(info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      check_out_var(vlapl);
    }
    if(info->flags & XC_FLAGS_NEEDS_TAU){
      check_out_var(vtau);
    }
  }

  if(out->v2rho2 != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_FXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of fxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v2rhosigma); 
    check_out_var(v2sigma2);
    if(info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      check_out_var(v2rholapl);
      check_out_var(v2sigmalapl);
      check_out_var(v2lapl2);
    }
    if(info->flags & XC_FLAGS_NEEDS_TAU){
      check_out_var(v2rhotau);
      check_out_var(v2sigmatau);
      check_out_var(v2tau2);
    }
    if((info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (info->flags & XC_FLAGS_NEEDS_TAU)){
      check_out_var(v2lapltau);
    }
  }

  if(out->v3rho3 != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_KXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of kxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v3rho2sigma);
    check_out_var(v3rhosigma2);
    check_out_var(v3sigma3);
    if(info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      check_out_var(v3rho2lapl);
      check_out_var(v3rhosigmalapl);
      check_out_var(v3rholapl2);
      check_out_var(v3sigma2lapl);
      check_out_var(v3sigmalapl2);
      check_out_var(v3lapl3);
    }
    if(info->flags & XC_FLAGS_NEEDS_TAU){
      check_out_var(v3rho2tau);
      check_out_var(v3rhosigmatau);
      check_out_var(v3rhotau2);
      check_out_var(v3sigma2tau);
      check_out_var(v3sigmatau2);
      check_out_var(v3tau3);
    }
    if((info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (info->flags & XC_FLAGS_NEEDS_TAU)){
      check_out_var(v3rholapltau);
      check_out_var(v3sigmalapltau);
      check_out_var(v3lapl2tau);
      check_out_var(v3lapltau2);
    }
  }

  if(out->v4rho4 != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_LXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of lxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v4rho3sigma);
    check_out_var(v4rho2sigma2);
    check_out_var(v4rhosigma3);
    check_out_var(v4sigma4);
    if(info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      check_out_var(v4rho3lapl);
      check_out_var(v4rho2sigmalapl);
      check_out_var(v4rho2lapl2);
      check_out_var(v4rhosigma2lapl);
      check_out_var(v4rhosigmalapl2);
      check_out_var(v4rholapl3);
      check_out_var(v4sigma3lapl);
      check_out_var(v4sigma2lapl2);
      check_out_var(v4sigmalapl3);
      check_out_var(v4lapl4);
    }
    if(info->flags & XC_FLAGS_NEEDS_TAU){
      check_out_var(v4rho3tau);
      check_out_var(v4rho2sigmatau);
      check_out_var(v4rho2tau2);
      check_out_var(v4rhosigma2tau);
      check_out_var(v4rhosigmatau2);
      check_out_var(v4rhotau3);
      check_out_var(v4sigma3tau);
      check_out_var(v4sigma2tau2);
      check_out_var(v4sigmatau3);
      check_out_var(v4tau4);
    }
    if((info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (info->flags & XC_FLAGS_NEEDS_TAU)){
      check_out_var(v4rho2lapltau);
      check_out_var(v4rhosigmalapltau);
      check_out_var(v4rholapl2tau);
      check_out_var(v4rholapltau2);
      check_out_var(v4sigma2lapltau);
      check_out_var(v4sigmalapl2tau);
      check_out_var(v4sigmalapltau2);
      check_out_var(v4lapl3tau);
      check_out_var(v4lapl2tau2);
      check_out_var(v4lapltau3); 
    }
  }
}